

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos)

{
  bool bVar1;
  ImVec2 *in_RSI;
  ImU32 cross_col;
  float cross_extent;
  ImVec2 center;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  bool is_clipped;
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed8;
  int num_segments;
  ImVec2 *pIVar2;
  undefined8 in_stack_fffffffffffffee0;
  ImRect *in_stack_fffffffffffffee8;
  ImDrawList *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  ImGuiButtonFlags in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  float in_stack_ffffffffffffff18;
  ImU32 in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  ImGuiID id_00;
  ImVec2 *lhs;
  ImRect *in_stack_ffffffffffffff28;
  ImDrawList *in_stack_ffffffffffffff30;
  ImDrawList *this;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImU32 local_68;
  float local_64;
  ImVec2 local_60;
  ImU32 local_58;
  byte local_54;
  byte local_52;
  byte local_51;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImRect local_30;
  ImGuiWindow *local_20;
  ImGuiContext *local_18;
  bool local_1;
  
  num_segments = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  id_00 = (ImGuiID)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  local_18 = GImGui;
  local_20 = GImGui->CurrentWindow;
  ImVec2::ImVec2(&local_48,GImGui->FontSize,GImGui->FontSize);
  local_40 = ::operator+(&in_stack_fffffffffffffec8->Min,(ImVec2 *)0x2adf66);
  local_50 = ::operator*(&in_stack_fffffffffffffec8->Min,0.0);
  local_38 = ::operator+(&in_stack_fffffffffffffec8->Min,(ImVec2 *)0x2adfa9);
  ImRect::ImRect(&local_30,in_RSI,&local_38);
  bVar1 = ItemAdd((ImRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                  (ImGuiID)((ulong)in_stack_fffffffffffffef0 >> 0x20),in_stack_fffffffffffffee8);
  local_51 = (bVar1 ^ 0xffU) & 1;
  local_54 = ButtonBehavior(in_stack_ffffffffffffff28,id_00,
                            (bool *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (bool *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            in_stack_ffffffffffffff0c);
  local_1 = (bool)local_54;
  if ((local_51 & 1) == 0) {
    local_58 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                           (float)in_stack_fffffffffffffee0);
    local_60 = ImRect::GetCenter(in_stack_fffffffffffffec8);
    if ((local_52 & 1) != 0) {
      ImMax<float>(2.0,local_18->FontSize * 0.5 + 1.0);
      ImDrawList::AddCircleFilled
                (in_stack_fffffffffffffef0,&in_stack_fffffffffffffee8->Min,
                 (float)((ulong)in_stack_fffffffffffffee0 >> 0x20),(ImU32)in_stack_fffffffffffffee0,
                 num_segments);
    }
    local_64 = local_18->FontSize * 0.5 * 0.7071 + -1.0;
    local_68 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                           (float)in_stack_fffffffffffffee0);
    pIVar2 = &local_70;
    ImVec2::ImVec2(pIVar2,0.5,0.5);
    lhs = &local_60;
    operator-=(lhs,pIVar2);
    ImVec2::ImVec2(&local_80,local_64,local_64);
    local_78 = ::operator+(&in_stack_fffffffffffffec8->Min,(ImVec2 *)0x2ae1bc);
    ImVec2::ImVec2(&local_90,-local_64,-local_64);
    local_88 = ::operator+(&in_stack_fffffffffffffec8->Min,(ImVec2 *)0x2ae202);
    ImDrawList::AddLine(in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->Min,lhs,
                        in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
    this = local_20->DrawList;
    ImVec2::ImVec2(&local_a0,local_64,-local_64);
    local_98 = ::operator+(&in_stack_fffffffffffffec8->Min,(ImVec2 *)0x2ae27f);
    pIVar2 = &local_b0;
    ImVec2::ImVec2(pIVar2,-local_64,local_64);
    local_a8 = ::operator+(&in_stack_fffffffffffffec8->Min,(ImVec2 *)0x2ae2be);
    ImDrawList::AddLine(this,pIVar2,lhs,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
    local_1 = (bool)(local_54 & 1);
  }
  return local_1;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos)//, float size)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We intentionally allow interaction when clipped so that a mechanical Alt,Right,Validate sequence close a window.
    // (this isn't the regular behavior of buttons, but it doesn't affect the user much because navigation tends to keep items visible).
    const ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    bool is_clipped = !ItemAdd(bb, id);

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    if (is_clipped)
        return pressed;

    // Render
    ImU32 col = GetColorU32(held ? ImGuiCol_ButtonActive : ImGuiCol_ButtonHovered);
    ImVec2 center = bb.GetCenter();
    if (hovered)
        window->DrawList->AddCircleFilled(center, ImMax(2.0f, g.FontSize * 0.5f + 1.0f), col, 12);

    float cross_extent = g.FontSize * 0.5f * 0.7071f - 1.0f;
    ImU32 cross_col = GetColorU32(ImGuiCol_Text);
    center -= ImVec2(0.5f, 0.5f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent, +cross_extent), center + ImVec2(-cross_extent, -cross_extent), cross_col, 1.0f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent, -cross_extent), center + ImVec2(-cross_extent, +cross_extent), cross_col, 1.0f);

    return pressed;
}